

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

void monster_death(monster *mon,player *p,_Bool stats)

{
  long lVar1;
  object *poVar2;
  _Bool _Var3;
  _Bool local_41;
  object *next;
  object *poStack_30;
  _Bool visible;
  object *obj;
  wchar_t local_20;
  wchar_t dump_gold;
  wchar_t dump_item;
  _Bool stats_local;
  player *p_local;
  monster *mon_local;
  
  local_20 = L'\0';
  obj._4_4_ = L'\0';
  poStack_30 = mon->held_obj;
  dump_gold._3_1_ = stats;
  _dump_item = p;
  p_local = (player *)mon;
  _Var3 = monster_is_visible(mon);
  local_41 = true;
  if (!_Var3) {
    local_41 = monster_is_unique((monster *)p_local);
  }
  lVar1._0_2_ = p_local->exp_frac;
  lVar1._2_2_ = p_local->mhp;
  lVar1._4_2_ = p_local->chp;
  lVar1._6_2_ = p_local->chp_frac;
  if (lVar1 != 0) {
    square_delete_object
              ((chunk *)cave,*(loc_conflict *)&(p_local->grid).y,*(object **)&p_local->exp_frac,true
               ,true);
    p_local->exp_frac = 0;
    p_local->mhp = 0;
    p_local->chp = 0;
    p_local->chp_frac = 0;
  }
  while (poStack_30 != (object *)0x0) {
    poVar2 = poStack_30->next;
    poStack_30->held_m_idx = 0;
    pile_excise((object **)&p_local->msp,poStack_30);
    if ((dump_gold._3_1_ & 1) == 0) {
      _Var3 = tval_is_money(poStack_30);
      if ((_Var3) && (poStack_30->origin != '\x11')) {
        obj._4_4_ = obj._4_4_ + L'\x01';
      }
      else {
        _Var3 = tval_is_money(poStack_30);
        if ((!_Var3) &&
           (((((poStack_30->origin == '\n' || (poStack_30->origin == '\f')) ||
              (poStack_30->origin == '\r')) ||
             ((poStack_30->origin == '\x15' || (poStack_30->origin == '\v')))) ||
            ((poStack_30->origin == '\x14' ||
             ((poStack_30->origin == '\x17' || (poStack_30->origin == '\x19')))))))) {
          local_20 = local_20 + L'\x01';
        }
      }
    }
    if ((local_41 == false) && ((dump_gold._3_1_ & 1) == 0)) {
      poStack_30->origin = '\x16';
    }
    drop_near((chunk *)cave,&stack0xffffffffffffffd0,L'\0',*(loc_conflict *)&(p_local->grid).y,true,
              false);
    poStack_30 = poVar2;
  }
  p_local->msp = 0;
  p_local->csp = 0;
  p_local->csp_frac = 0;
  p_local->stat_max[0] = 0;
  if ((local_41 != false) && ((local_20 != L'\0' || (obj._4_4_ != L'\0')))) {
    lore_treasure((monster *)p_local,local_20,obj._4_4_);
  }
  _dump_item->upkeep->redraw = _dump_item->upkeep->redraw | 0x400000;
  quest_check(_dump_item,(monster *)p_local);
  return;
}

Assistant:

void monster_death(struct monster *mon, struct player *p, bool stats)
{
	int dump_item = 0;
	int dump_gold = 0;
	struct object *obj = mon->held_obj;

	bool visible = monster_is_visible(mon) || monster_is_unique(mon);

	/* Delete any mimicked objects */
	if (mon->mimicked_obj) {
		square_delete_object(cave, mon->grid, mon->mimicked_obj, true, true);
		mon->mimicked_obj = NULL;
	}

	/* Drop objects being carried */
	while (obj) {
		struct object *next = obj->next;

		/* Object no longer held */
		obj->held_m_idx = 0;
		pile_excise(&mon->held_obj, obj);

		/* Count it and drop it - refactor once origin is a bitflag */
		if (!stats) {
			if (tval_is_money(obj) && (obj->origin != ORIGIN_STOLEN))
				dump_gold++;
			else if (!tval_is_money(obj) && ((obj->origin == ORIGIN_DROP)
					|| (obj->origin == ORIGIN_DROP_PIT)
					|| (obj->origin == ORIGIN_DROP_VAULT)
					|| (obj->origin == ORIGIN_DROP_SUMMON)
					|| (obj->origin == ORIGIN_DROP_SPECIAL)
					|| (obj->origin == ORIGIN_DROP_BREED)
					|| (obj->origin == ORIGIN_DROP_POLY)
					|| (obj->origin == ORIGIN_DROP_WIZARD)))
				dump_item++;
		}

		/* Change origin if monster is invisible, unless we're in stats mode */
		if (!visible && !stats)
			obj->origin = ORIGIN_DROP_UNKNOWN;

		drop_near(cave, &obj, 0, mon->grid, true, false);
		obj = next;
	}

	/* Forget objects */
	mon->held_obj = NULL;

	/* Take note of any dropped treasure */
	if (visible && (dump_item || dump_gold))
		lore_treasure(mon, dump_item, dump_gold);

	/* Update monster list window */
	p->upkeep->redraw |= PR_MONLIST;

	/* Check if we finished a quest */
	quest_check(p, mon);
}